

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O3

int obudec_read_obu_payload
              (AvxInputContext *input_ctx,size_t payload_length,uint8_t *obu_data,size_t *bytes_read
              ,_Bool buffered)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = -1;
  if (bytes_read != (size_t *)0x0 && (obu_data != (uint8_t *)0x0 && payload_length != 0)) {
    sVar1 = buffer_input(input_ctx,payload_length,obu_data,false);
    if (sVar1 == payload_length) {
      *bytes_read = *bytes_read + payload_length;
      iVar2 = 0;
    }
    else {
      obudec_read_obu_payload_cold_1();
    }
  }
  return iVar2;
}

Assistant:

static int obudec_read_obu_payload(struct AvxInputContext *input_ctx,
                                   size_t payload_length, uint8_t *obu_data,
                                   size_t *bytes_read, bool buffered) {
  if (!input_ctx || payload_length == 0 || !obu_data || !bytes_read) return -1;

  if (buffer_input(input_ctx, payload_length, obu_data, buffered) !=
      payload_length) {
    fprintf(stderr, "obudec: Failure reading OBU payload.\n");
    return -1;
  }

  *bytes_read += payload_length;
  return 0;
}